

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

void * AllocUnits(CPpmd8 *p,uint indx)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  void *retVal;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar11;
  long lVar12;
  Byte *pBVar13;
  Byte *pBVar14;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  ulong uStack_40;
  Byte *pBStack_38;
  ulong uVar10;
  
  uVar9 = (ulong)p->FreeList[indx];
  if (uVar9 != 0) {
    pBVar13 = p->Base;
    p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar13 + uVar9 + 4);
    p->Stamps[indx] = p->Stamps[indx] - 1;
    return pBVar13 + uVar9;
  }
  lVar6 = (ulong)p->Indx2Units[indx] * 0xc;
  pBVar13 = p->LoUnit;
  if ((uint)(*(int *)&p->HiUnit - (int)pBVar13) < (uint)lVar6) {
    uVar10 = (ulong)indx;
    uVar9 = (ulong)indx;
    uVar11 = uVar10;
    if (p->GlueCount == 0) {
      uStack_4c = 0;
      p->GlueCount = 0x2000;
      memset(p->Stamps,0,0x98);
      pBVar13 = p->LoUnit;
      if (pBVar13 != p->HiUnit) {
        pBVar13[0] = '\0';
        pBVar13[1] = '\0';
        pBVar13[2] = '\0';
        pBVar13[3] = '\0';
      }
      puVar7 = &uStack_4c;
      for (lVar6 = 0; lVar6 != 0x26; lVar6 = lVar6 + 1) {
        uVar8 = p->FreeList[lVar6];
        p->FreeList[lVar6] = 0;
        while (uVar8 != 0) {
          pBVar13 = p->Base;
          uVar9 = (ulong)uVar8;
          if (*(int *)(pBVar13 + uVar9 + 8) != 0) {
            *puVar7 = uVar8;
            while( true ) {
              lVar12 = (ulong)*(uint *)(pBVar13 + uVar9 + 8) * 0xc;
              if (*(int *)(pBVar13 + lVar12 + uVar9) != -1) break;
              lVar12 = lVar12 + uVar9;
              *(uint *)(pBVar13 + uVar9 + 8) =
                   *(uint *)(pBVar13 + uVar9 + 8) + *(int *)(pBVar13 + lVar12 + 8);
              pBVar14 = pBVar13 + lVar12 + 8;
              pBVar14[0] = '\0';
              pBVar14[1] = '\0';
              pBVar14[2] = '\0';
              pBVar14[3] = '\0';
            }
            puVar7 = (uint *)(pBVar13 + uVar9 + 4);
          }
          uVar8 = *(uint *)(pBVar13 + uVar9 + 4);
        }
      }
      uStack_48 = indx;
      uStack_40 = (ulong)indx;
      *puVar7 = 0;
      pBStack_38 = p->Units2Indx;
      uVar8 = uStack_4c;
      while (uVar5 = uVar8, uVar5 != 0) {
        pBVar13 = p->Base;
        iVar2 = *(int *)(pBVar13 + (ulong)uVar5 + 8);
        uVar8 = *(uint *)(pBVar13 + (ulong)uVar5 + 4);
        if (iVar2 != 0) {
          pBVar14 = pBVar13 + uVar5;
          uStack_44 = *(uint *)(pBVar13 + (ulong)uVar5 + 4);
          for (lVar6 = 0; iVar3 = (int)lVar6, 0x80 < (uint)(iVar2 + iVar3); lVar6 = lVar6 + -0x80) {
            InsertNode(p,pBVar14,0x25);
            pBVar14 = pBVar14 + 0x600;
          }
          bVar1 = pBStack_38[lVar6 + (ulong)(iVar2 - 1)];
          uVar8 = (uint)bVar1;
          if (iVar3 + (iVar2 - (uint)p->Indx2Units[bVar1]) != 0) {
            uVar8 = bVar1 - 1;
            InsertNode(p,pBVar14 + (ulong)p->Indx2Units[uVar8] * 0xc,
                       (iVar2 - (uint)p->Indx2Units[uVar8]) + -1 + iVar3);
          }
          InsertNode(p,pBVar14,uVar8);
          uVar8 = uStack_44;
        }
      }
      uVar4 = (ulong)p->FreeList[uStack_40];
      uVar10 = (ulong)uStack_48;
      uVar9 = uStack_40;
      uVar11 = uVar10;
      if (uVar4 != 0) {
        pBVar13 = p->Base;
        p->FreeList[uStack_40] = *(CPpmd_Void_Ref *)(pBVar13 + uVar4 + 4);
        p->Stamps[uStack_40] = p->Stamps[uStack_40] - 1;
        return pBVar13 + uVar4;
      }
    }
    do {
      if ((int)uVar10 == 0x25) {
        bVar1 = p->Indx2Units[uVar9];
        p->GlueCount = p->GlueCount - 1;
        if ((uint)bVar1 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
          pBVar13 = p->UnitsStart + (ulong)bVar1 * -0xc;
          p->UnitsStart = pBVar13;
          return pBVar13;
        }
        return (void *)0x0;
      }
      uVar8 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar8;
      uVar4 = (ulong)p->FreeList[uVar10];
    } while (uVar4 == 0);
    pBVar13 = p->Base + uVar4;
    p->FreeList[uVar10] = *(CPpmd_Void_Ref *)(p->Base + uVar4 + 4);
    p->Stamps[uVar10] = p->Stamps[uVar10] - 1;
    SplitBlock(p,pBVar13,uVar8,(uint)uVar11);
    return pBVar13;
  }
  p->LoUnit = pBVar13 + lVar6;
  return pBVar13;
}

Assistant:

static void *AllocUnits(CPpmd8 *p, unsigned indx)
{
  UInt32 numBytes;
  if (p->FreeList[indx] != 0)
    return RemoveNode(p, indx);
  numBytes = U2B(I2U(indx));
  if (numBytes <= (UInt32)(p->HiUnit - p->LoUnit))
  {
    void *retVal = p->LoUnit;
    p->LoUnit += numBytes;
    return retVal;
  }
  return AllocUnitsRare(p, indx);
}